

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::ostream_iterator<char,char,std::char_traits<char>>,char>>::
str_writer<char>::operator()
          (str_writer<char> *this,ostream_iterator<char,_char,_std::char_traits<char>_> *it)

{
  long lVar1;
  char *__value;
  ostream_iterator<char,_char,_std::char_traits<char>_> local_38;
  
  __value = *(char **)this;
  local_38._M_stream = it->_M_stream;
  local_38._M_string = it->_M_string;
  if (0 < *(long *)(this + 8)) {
    lVar1 = *(long *)(this + 8) + 1;
    do {
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(&local_38,__value);
      __value = __value + 1;
      lVar1 = lVar1 + -1;
    } while (1 < lVar1);
  }
  it->_M_stream = local_38._M_stream;
  it->_M_string = local_38._M_string;
  return;
}

Assistant:

void operator()(It &&it) const {
      it = internal::copy_str<char_type>(s, s + size_, it);
    }